

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *
dg::vr::RelationsAnalyzer::getFroms(ValueRelations *rels,V val)

{
  bool bVar1;
  size_type sVar2;
  pointer this;
  Value *in_RDX;
  V in_RSI;
  Bucket *in_RDI;
  VectorSet<const_llvm::Value_*> *eqvals;
  GetElementPtrInst *gep;
  RelationsMap *pointedFrom;
  Bucket *mH;
  LoadInst *load;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *result;
  V in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  ushort in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar3;
  Bucket *this_00;
  const_iterator in_stack_ffffffffffffff68;
  Handle in_stack_ffffffffffffff70;
  ValueRelations *in_stack_ffffffffffffff78;
  undefined1 local_70 [8];
  undefined1 local_68 [48];
  undefined1 *local_38;
  HandlePtr local_30;
  LoadInst *local_28;
  byte local_19;
  Value *local_18;
  V local_10;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
            ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)0x1cf7c9);
  local_28 = ValueRelations::getInstance<llvm::LoadInst>
                       ((ValueRelations *)in_RDI,
                        (V)CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,
                                             CONCAT24(in_stack_ffffffffffffff54,
                                                      in_stack_ffffffffffffff50))));
  local_30 = ValueRelations::getHandle
                       ((ValueRelations *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,
                                          CONCAT24(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50))),
                        in_stack_ffffffffffffff48);
  do {
    while( true ) {
      uVar3 = true;
      if ((local_28 == (LoadInst *)0x0) &&
         (in_stack_ffffffffffffff56 = false, uVar3 = in_stack_ffffffffffffff56,
         local_30 != (HandlePtr)0x0)) {
        in_stack_ffffffffffffff56 =
             ValueRelations::has<dg::vr::Bucket>
                       ((ValueRelations *)this_00,in_RDI,
                        CONCAT13(1,(uint3)in_stack_ffffffffffffff54));
        uVar3 = in_stack_ffffffffffffff56;
      }
      if ((bool)uVar3 == false) {
        local_19 = 1;
        goto LAB_001cfa7d;
      }
      if (local_28 == (LoadInst *)0x0) break;
      local_18 = llvm::LoadInst::getPointerOperand((LoadInst *)0x1cf870);
      local_30 = ValueRelations::getHandle
                           ((ValueRelations *)
                            CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff56,
                                                    CONCAT24(in_stack_ffffffffffffff54,
                                                             in_stack_ffffffffffffff50))),
                            in_stack_ffffffffffffff48);
      local_28 = ValueRelations::getInstance<llvm::LoadInst>
                           ((ValueRelations *)in_RDI,
                            (V)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff56,
                                                       CONCAT24(in_stack_ffffffffffffff54,
                                                                in_stack_ffffffffffffff50))));
      std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
      emplace_back<llvm::Value_const*&>
                ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this_00,
                 (Value **)in_RDI);
    }
    in_stack_ffffffffffffff48 = local_10;
    memset(local_70,0,8);
    Relations::Relations((Relations *)0x1cf8f0);
    Relations::pf((Relations *)0x1cf8fa);
    ValueRelations::getRelated<llvm::Value_const*>
              (in_stack_ffffffffffffff78,(Value **)in_stack_ffffffffffffff70,
               (Relations *)in_stack_ffffffffffffff68._M_current);
    local_38 = local_68;
    sVar2 = std::
            map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
            ::size((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                    *)0x1cf92d);
    if (sVar2 == 1) {
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
               *)in_stack_ffffffffffffff48);
      this = std::
             _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                           *)0x1cf964);
      local_30 = std::reference_wrapper<const_dg::vr::Bucket>::get(&this->first);
      local_28 = ValueRelations::getInstance<llvm::LoadInst>
                           (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (local_28 == (LoadInst *)0x0) {
        in_stack_ffffffffffffff78 =
             (ValueRelations *)
             ValueRelations::getInstance<llvm::GetElementPtrInst>
                       (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        if (in_stack_ffffffffffffff78 == (ValueRelations *)0x0) {
          in_stack_ffffffffffffff70 =
               (Handle)ValueRelations::getEqual((ValueRelations *)this_00,in_RDI);
          bVar1 = VectorSet<const_llvm::Value_*>::empty((VectorSet<const_llvm::Value_*> *)0x1cfa0a);
          if (bVar1) {
            local_19 = 1;
            bVar1 = true;
            goto LAB_001cfa52;
          }
          in_stack_ffffffffffffff68 =
               VectorSet<const_llvm::Value_*>::begin
                         ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff48);
          __gnu_cxx::
          __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
          ::operator*((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                       *)&stack0xffffffffffffff68);
          std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
          emplace_back<llvm::Value_const*const&>
                    ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this_00,
                     (Value **)in_RDI);
        }
        else {
          std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
          emplace_back<llvm::GetElementPtrInst_const*&>
                    ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this_00,
                     (GetElementPtrInst **)in_RDI);
        }
      }
      else {
        std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
        emplace_back<llvm::LoadInst_const*&>
                  ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this_00,
                   (LoadInst **)in_RDI);
      }
      bVar1 = false;
    }
    else {
      local_19 = 1;
      bVar1 = true;
    }
LAB_001cfa52:
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
            *)0x1cfa5c);
  } while (!bVar1);
LAB_001cfa7d:
  if ((local_19 & 1) == 0) {
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this_00);
  }
  return (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this_00;
}

Assistant:

std::vector<V> RelationsAnalyzer::getFroms(const ValueRelations &rels, V val) {
    std::vector<V> result;
    const auto *load = rels.getInstance<llvm::LoadInst>(val);
    const auto *mH = rels.getHandle(val);

    while (load || (mH && rels.has(*mH, Relations::PF))) {
        if (load) {
            val = load->getPointerOperand();
            mH = rels.getHandle(val);
            load = rels.getInstance<llvm::LoadInst>(val);
            result.emplace_back(val);
        } else {
            const auto &pointedFrom = rels.getRelated(val, Relations().pf());
            if (pointedFrom.size() != 1)
                return result;
            mH = &pointedFrom.begin()->first.get();
            load = rels.getInstance<llvm::LoadInst>(*mH);
            if (load)
                result.emplace_back(load);
            else if (const auto *gep =
                             rels.getInstance<llvm::GetElementPtrInst>(*mH))
                result.emplace_back(gep);
            else {
                const auto &eqvals = rels.getEqual(*mH);
                if (eqvals.empty())
                    return result;
                result.emplace_back(*eqvals.begin());
            }
        }
    }

    return result;
}